

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowdiscrepancy.cpp
# Opt level: O2

vector<pbrt::DigitPermutation,_pstd::pmr::polymorphic_allocator<pbrt::DigitPermutation>_> *
pbrt::ComputeRadicalInversePermutations(uint32_t seed,Allocator alloc)

{
  int iVar1;
  undefined4 extraout_var;
  vector<pbrt::DigitPermutation,_pstd::pmr::polymorphic_allocator<pbrt::DigitPermutation>_> *perms;
  Allocator alloc_local;
  _Any_data local_38;
  code *pcStack_28;
  code *pcStack_20;
  
  alloc_local = alloc;
  iVar1 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x20,8);
  perms = (vector<pbrt::DigitPermutation,_pstd::pmr::polymorphic_allocator<pbrt::DigitPermutation>_>
           *)CONCAT44(extraout_var,iVar1);
  (perms->alloc).memoryResource = alloc.memoryResource;
  perms->nStored = 0;
  perms->ptr = (DigitPermutation *)0x0;
  perms->nAlloc = 0;
  pstd::vector<pbrt::DigitPermutation,_pstd::pmr::polymorphic_allocator<pbrt::DigitPermutation>_>::
  resize(perms,1000);
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  pcStack_28 = (code *)0x0;
  pcStack_20 = (code *)0x0;
  local_38._M_unused._M_object = operator_new(0x18);
  *(vector<pbrt::DigitPermutation,_pstd::pmr::polymorphic_allocator<pbrt::DigitPermutation>_> ***)
   local_38._M_unused._0_8_ = &perms;
  *(Allocator **)((long)local_38._M_unused._0_8_ + 8) = &alloc_local;
  *(uint32_t *)((long)local_38._M_unused._0_8_ + 0x10) = seed;
  pcStack_20 = std::
               _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/lowdiscrepancy.cpp:130:36)>
               ::_M_invoke;
  pcStack_28 = std::
               _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/lowdiscrepancy.cpp:130:36)>
               ::_M_manager;
  ParallelFor(0,1000,(function<void_(long)> *)&local_38);
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  return perms;
}

Assistant:

pstd::vector<DigitPermutation> *ComputeRadicalInversePermutations(uint32_t seed,
                                                                  Allocator alloc) {
    pstd::vector<DigitPermutation> *perms =
        alloc.new_object<pstd::vector<DigitPermutation>>(alloc);
    perms->resize(PrimeTableSize);
    ParallelFor(0, PrimeTableSize, [&perms, &alloc, seed](int64_t i) {
        (*perms)[i] = DigitPermutation(Primes[i], seed, alloc);
    });
    return perms;
}